

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall
kratos::FSM::generate_state_transition
          (FSM *this,Enum *enum_def,EnumVar *current_state,EnumVar *next_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  FSMState *pFVar3;
  bool bVar4;
  undefined1 auVar5 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 uVar7;
  const_iterator cVar8;
  InternalException *this_00;
  iterator __begin2;
  anon_class_8_1_8991fb9c aVar9;
  __weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *__r;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 __k [8];
  basic_string_view<char> bVar10;
  format_args args;
  string_view format_str;
  undefined1 local_178 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  undefined1 local_158 [8];
  shared_ptr<kratos::CombinationalStmtBlock> state_comb;
  FSMState *next_fsm_state;
  undefined1 auStack_138 [8];
  shared_ptr<kratos::IfStmt> top_if;
  shared_ptr<kratos::FunctionStmtBlock> func_def;
  anon_class_8_1_8991fb9c local_110;
  anon_class_8_1_8991fb9c add_debug_info_to_stmt;
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  transitions;
  undefined1 local_e0 [8];
  shared_ptr<kratos::SwitchStmt> case_state_comb;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  uint local_b4;
  undefined1 local_b0 [16];
  shared_ptr<kratos::IfStmt> if_;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::FunctionCallStmt> func_stmt;
  shared_ptr<kratos::AssignStmt> stmt;
  undefined1 auStack_48 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  
  local_b0._0_8_ = state_name_mapping;
  Generator::combinational((Generator *)local_158);
  top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (this->moore_ == false) {
    get_func_def((FSM *)&func_stmt.
                         super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
               &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
               &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(current_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_178,this,false
            );
  states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_110.this = this;
  case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)enum_def;
  for (__k = local_178; auVar5 = local_158,
      __k != (undefined1  [8])
             states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
      __k = (undefined1  [8])((long)__k + 8)) {
    std::__detail::
    _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)local_b0._0_8_,(key_type *)__k);
    local_b0._8_8_ = (IfStmt *)0x0;
    if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    auStack_138 = (undefined1  [8])0x0;
    top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::vector((vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              *)&add_debug_info_to_stmt,&(*(key_type *)__k)->transitions_);
    transitions.
    super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         transitions.
         super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if ((long)transitions.
              super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)add_debug_info_to_stmt.this == 0x10)
    {
      local_b4 = (uint)(((add_debug_info_to_stmt.this)->fsm_name_)._M_dataplus._M_p == (pointer)0x0)
      ;
    }
    else {
      local_b4 = 0;
    }
    bVar4 = false;
    aVar9 = add_debug_info_to_stmt;
    while( true ) {
      _Var6._M_pi = case_state_comb.
                    super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      if (aVar9.this ==
          (FSM *)transitions.
                 super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) break;
      pcVar2 = ((aVar9.this)->fsm_name_)._M_dataplus._M_p;
      if (pcVar2 == (pointer)0x0) {
        if ((long)transitions.
                  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)add_debug_info_to_stmt.this ==
            0x10) {
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )((aVar9.this)->fsm_name_)._M_string_length;
          p_Var1 = &func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          get_next_state_stmt((FSM *)p_Var1,(Enum *)this,
                              (EnumVar *)
                              case_state_comb.
                              super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,(FSMState *)next_state,*(FSMState **)__k,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_R9.values_);
          transitions.
          super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e0;
          Enum::get_enum((Enum *)auStack_78,(string *)_Var6._M_pi);
          auStack_48 = auStack_78;
          stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          auStack_78 = (undefined1  [8])0x0;
          func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::AssignStmt,void>
                    (local_c8,(__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1
                    );
          SwitchStmt::add_switch_case
                    ((SwitchStmt *)
                     transitions.
                     super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (shared_ptr<kratos::Const> *)auStack_48,(shared_ptr<kratos::Stmt> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_stmt);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
          break;
        }
        state_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((aVar9.this)->fsm_name_)._M_string_length;
        if (!bVar4) {
          bVar4 = true;
        }
      }
      else {
        __r = (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(pcVar2 + 0x68);
        if ((IfStmt *)local_b0._8_8_ == (IfStmt *)0x0) {
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_48,__r);
          p_Var1 = &func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>>
                    ((shared_ptr<kratos::Var> *)p_Var1);
          std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8),
                     (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )((aVar9.this)->fsm_name_)._M_string_length;
          get_next_state_stmt((FSM *)p_Var1,(Enum *)this,
                              (EnumVar *)
                              case_state_comb.
                              super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,(FSMState *)next_state,*(FSMState **)__k,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_R9.values_);
          uVar7 = local_b0._8_8_;
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::AssignStmt,void>
                    ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                     (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
          IfStmt::add_then_stmt((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)auStack_48);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
          auStack_48 = (undefined1  [8])0x0;
          stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (this->moore_ == false) {
            get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)
                               &top_if.
                                super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(FSMState *)((aVar9.this)->fsm_name_)._M_string_length,
                               (shared_ptr<kratos::FunctionCallStmt> *)auStack_48);
            uVar7 = local_b0._8_8_;
            std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::FunctionCallStmt,void>
                      ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                       (__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2> *)
                       auStack_48);
            IfStmt::add_then_stmt((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)auStack_78);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_stmt);
          }
          std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_138,
                     (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
          generate_state_transition::anon_class_8_1_8991fb9c::operator()
                    (&local_110,(shared_ptr<kratos::FunctionCallStmt> *)auStack_48,*(FSMState **)__k
                    );
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
        }
        else {
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_48,__r);
          std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>>
                    ((shared_ptr<kratos::Var> *)
                     &func_stmt.
                      super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
          in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )((aVar9.this)->fsm_name_)._M_string_length;
          get_next_state_stmt((FSM *)auStack_48,(Enum *)this,
                              (EnumVar *)
                              case_state_comb.
                              super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,(FSMState *)next_state,*(FSMState **)__k,
                              (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_R9.values_);
          _Var6 = func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
          auStack_78 = (undefined1  [8])0x0;
          func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::AssignStmt,void>
                    (local_c8,(__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                              auStack_48);
          IfStmt::add_then_stmt((IfStmt *)_Var6._M_pi,(shared_ptr<kratos::Stmt> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
          if (this->moore_ == false) {
            get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)
                               &top_if.
                                super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(FSMState *)((aVar9.this)->fsm_name_)._M_string_length,
                               (shared_ptr<kratos::FunctionCallStmt> *)auStack_78);
            _Var6 = func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
            std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::FunctionCallStmt,void>
                      (local_c8,(__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                                 *)auStack_78);
            IfStmt::add_then_stmt((IfStmt *)_Var6._M_pi,(shared_ptr<kratos::Stmt> *)local_c8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
          }
          generate_state_transition::anon_class_8_1_8991fb9c::operator()
                    (&local_110,(shared_ptr<kratos::FunctionCallStmt> *)auStack_78,*(FSMState **)__k
                    );
          uVar7 = local_b0._8_8_;
          p_Var1 = &func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<kratos::IfStmt,void>
                    (local_c8,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
          IfStmt::add_else_stmt((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)local_c8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
          std::__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8),
                     (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_stmt);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
        }
      }
      aVar9.this = (FSM *)&((aVar9.this)->fsm_name_).field_2;
    }
    _Var6._M_pi = case_state_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    if (bVar4) {
      p_Var1 = &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
               )state_comb.
                super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      get_next_state_stmt((FSM *)p_Var1,(Enum *)this,
                          (EnumVar *)
                          case_state_comb.
                          super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,(FSMState *)next_state,*(FSMState **)__k,
                          (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)state_comb.
                             super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
      uVar7 = local_b0._8_8_;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::AssignStmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_48,
                 (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)p_Var1);
      IfStmt::add_else_stmt((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)auStack_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
      auStack_48 = (undefined1  [8])0x0;
      stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (this->moore_ == false) {
        get_func_call_stmt((shared_ptr<kratos::FunctionStmtBlock> *)
                           &top_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           (FSMState *)
                           state_comb.
                           super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,(shared_ptr<kratos::FunctionCallStmt> *)auStack_48);
        uVar7 = local_b0._8_8_;
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::FunctionCallStmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                   (__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_48)
        ;
        IfStmt::add_then_stmt((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)auStack_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_stmt);
      }
      generate_state_transition::anon_class_8_1_8991fb9c::operator()
                (&local_110,(shared_ptr<kratos::FunctionCallStmt> *)auStack_48,*(FSMState **)__k);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    }
    auVar5 = local_e0;
    if ((char)local_b4 == '\0') {
      if (auStack_138 == (undefined1  [8])0x0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        auStack_48 = (undefined1  [8])((*(key_type *)__k)->name_)._M_dataplus._M_p;
        stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((*(key_type *)__k)->name_)._M_string_length;
        bVar10 = fmt::v7::to_string_view<char,_0>
                           ("Unable to find any state transition for state {0}");
        format_str.data_ = (char *)bVar10.size_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_48;
        format_str.size_ = 0xd;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)
                   &func_stmt.
                    super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(detail *)bVar10.data_,format_str,args);
        InternalException::InternalException
                  (this_00,(string *)
                           &func_stmt.
                            super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      Enum::get_enum((Enum *)auStack_48,(string *)_Var6._M_pi);
      func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_48;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auStack_48 = (undefined1  [8])0x0;
      stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                 (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_138);
      SwitchStmt::add_switch_case
                ((SwitchStmt *)auVar5,
                 (shared_ptr<kratos::Const> *)
                 &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(shared_ptr<kratos::Stmt> *)auStack_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_stmt);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
    }
    std::
    _Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                     *)&add_debug_info_to_stmt);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&top_if);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  }
  Var::assign((Var *)&add_debug_info_to_stmt,&next_state->super_Var,(AssignmentType)current_state);
  func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)add_debug_info_to_stmt.this;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       transitions.
       super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  add_debug_info_to_stmt.this = (FSM *)0x0;
  transitions.
  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  StmtBlock::add_stmt((StmtBlock *)auVar5,
                      (shared_ptr<kratos::Stmt> *)
                      &func_stmt.
                       super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&transitions);
  func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  cVar8 = std::
          _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
          ::find((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  *)((long)local_e0 + 0xe0),
                 (key_type *)
                 &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
  if (cVar8._M_node == (_Base_ptr)((long)local_e0 + 0xe8)) {
    pFVar3 = *(FSMState **)((long)local_e0 + 0x108);
    if (pFVar3 == (FSMState *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
      if (((ulong)pFVar3 & (ulong)((long)&pFVar3[-1].output_fn_ln_._M_h._M_single_bucket + 7U)) == 0
         ) goto LAB_0041c0b4;
    }
    func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    Var::assign((Var *)auStack_48,&next_state->super_Var,(AssignmentType)current_state);
    add_debug_info_to_stmt.this = (FSM *)auStack_48;
    transitions.
    super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_48 = (undefined1  [8])0x0;
    stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    SwitchStmt::add_switch_case
              ((SwitchStmt *)local_e0,
               (shared_ptr<kratos::Const> *)
               &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<kratos::Stmt> *)&add_debug_info_to_stmt);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&transitions);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt_1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
LAB_0041c0b4:
  p_Var1 = &func_stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::SwitchStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)p_Var1,
             (__shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2> *)local_e0);
  StmtBlock::add_stmt((StmtBlock *)local_158,(shared_ptr<kratos::Stmt> *)p_Var1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  std::_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~_Vector_base
            ((_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&case_state_comb);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_def);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&state_comb);
  return;
}

Assistant:

void FSM::generate_state_transition(
    Enum& enum_def, EnumVar& current_state, EnumVar& next_state,
    const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto state_comb = generator_->combinational();

    std::shared_ptr<FunctionStmtBlock> func_def = nullptr;
    if (!moore_) func_def = get_func_def();
    auto case_state_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    auto add_debug_info_to_stmt = [this](std::shared_ptr<FunctionCallStmt>& func_stmt,
                                         const FSMState* state) {
        if (generator_->debug) {
            if (func_stmt) {
                add_debug_info(state, func_stmt);
                func_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
        }
    };
    for (auto const& state : states) {
        auto const& state_name = state_name_mapping.at(state);
        // a list of if statements
        std::shared_ptr<IfStmt> if_ = nullptr;
        std::shared_ptr<IfStmt> top_if = nullptr;
        auto transitions = state->transitions();
        // slide through condition
        bool has_slide_through = false;
        if (transitions.size() == 1 && transitions[0].first == nullptr) {
            has_slide_through = true;
        }
        std::optional<std::pair<Var *, FSMState *>> default_state;
        for (auto const& [cond, next_fsm_state] : transitions) {
            if (!cond && (transitions.size() == 1)) {
                // direct transition
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                case_state_comb->add_switch_case(enum_def.get_enum(state_name), stmt);
                break;
            } else if (!cond) {
                // we have a default case here
                default_state= std::make_pair(cond, next_fsm_state);
                continue;
            }

            if (!if_) {
                if_ = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                if_->add_then_stmt(stmt);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    if_->add_then_stmt(func_stmt);
                }
                top_if = if_;
                add_debug_info_to_stmt(func_stmt, state);
            } else {
                auto new_if = std::make_shared<IfStmt>(cond->shared_from_this());
                auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                                state_name_mapping);
                // mealy machine need to add extra state transition outputs
                std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
                new_if->add_then_stmt(stmt);
                if (!moore_) {
                    get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                    new_if->add_then_stmt(func_stmt);
                }
                add_debug_info_to_stmt(func_stmt, state);
                if_->add_else_stmt(new_if);
                if_ = new_if;
            }
        }

        if (default_state) {
            auto* next_fsm_state = default_state->second;
            auto stmt = get_next_state_stmt(enum_def, next_state, state, next_fsm_state,
                                            state_name_mapping);
            if_->add_else_stmt(stmt);
            // mealy machine need to add extra state transition outputs
            std::shared_ptr<FunctionCallStmt> func_stmt = nullptr;
            if (!moore_) {
                get_func_call_stmt(func_def, next_fsm_state, func_stmt);
                if_->add_then_stmt(func_stmt);
            }
            add_debug_info_to_stmt(func_stmt, state);
        }

        if (!has_slide_through) {
            if (!top_if)
                throw InternalException(
                    ::format("Unable to find any state transition for state {0}", state->name()));
            case_state_comb->add_switch_case(enum_def.get_enum(state_name), top_if);
        }
    }

    // prevent latch generation
    state_comb->add_stmt(next_state.assign(current_state, AssignmentType::Blocking));

    // also default case
    if (case_state_comb->body().find(nullptr) == case_state_comb->body().end() &&
        !is_2_power(case_state_comb->body().size())) {
        case_state_comb->add_switch_case(
            nullptr, next_state.assign(current_state, AssignmentType::Blocking));
    }

    // add it to the state_comb
    state_comb->add_stmt(case_state_comb);
}